

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

bool __thiscall
QFileSystemModel::setData(QFileSystemModel *this,QModelIndex *idx,QVariant *value,int role)

{
  QList<QString> *this_00;
  QFileSystemModelPrivate *this_01;
  QAbstractItemModel *pQVar1;
  QFileInfoGatherer *this_02;
  int *piVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  qsizetype qVar6;
  Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *pNVar7;
  QFileSystemNode *pQVar8;
  QFileSystemNode **ppQVar9;
  QFileSystemNode *pQVar10;
  bool bVar11;
  pointer __p;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QDir local_e0 [8];
  QString local_d8;
  QString local_b8;
  QString local_98;
  QStringView local_78;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QString *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar11 = false;
  if (((idx->r < 0) || (idx->c < 0)) || (bVar11 = false, (idx->m).ptr == (QAbstractItemModel *)0x0))
  goto LAB_006128b9;
  if (role == 2 && idx->c == 0) {
    this_01 = *(QFileSystemModelPrivate **)&this->field_0x8;
    uVar5 = (**(code **)(*(long *)this + 0x138))(this,idx);
    if ((uVar5 & 2) != 0) {
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString();
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.d._0_4_ = 0xaaaaaaaa;
      local_b8.d.d._4_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._4_4_ = 0xaaaaaaaa;
      pQVar1 = (idx->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_68.shared = (PrivateShared *)0x0;
        local_68._8_8_ = (QString *)0x0;
        local_68._16_8_ = (QString *)0x0;
        local_50 = (QString *)0x2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_68,pQVar1,idx,0);
      }
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)&local_68);
      if (local_98.d.size == local_b8.d.size) {
        QVar13.m_data._4_4_ = local_b8.d.ptr._4_4_;
        QVar13.m_data._0_4_ = local_b8.d.ptr._0_4_;
        QVar12.m_data = local_98.d.ptr;
        QVar12.m_size = local_98.d.size;
        QVar13.m_size = local_98.d.size;
        cVar3 = QtPrivate::equalStrings(QVar12,QVar13);
        bVar11 = true;
        if (cVar3 == '\0') goto LAB_006129af;
      }
      else {
LAB_006129af:
        local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.d.d._0_4_ = 0xaaaaaaaa;
        local_d8.d.d._4_4_ = 0xaaaaaaaa;
        local_d8.d.ptr._0_4_ = 0xaaaaaaaa;
        local_d8.d.ptr._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)this + 0x68))(&local_68,this,idx);
        filePath(&local_d8,this,(QModelIndex *)&local_68);
        if ((undefined1 *)local_98.d.size == (undefined1 *)0x0) {
LAB_00612c30:
          bVar11 = false;
        }
        else {
          QDir::toNativeSeparators((QString *)local_68.data);
          local_78.m_size = local_68._16_8_;
          local_78.m_data = (storage_type_conflict *)local_68._8_8_;
          qVar6 = QStringView::indexOf(&local_78,(QChar)0x2f,0,CaseSensitive);
          if ((QArrayData *)local_68.shared != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_68.shared = *(int *)local_68.shared + -1;
            UNLOCK();
            if (*(int *)local_68.shared == 0) {
              QArrayData::deallocate((QArrayData *)local_68.shared,2,0x10);
            }
          }
          if (qVar6 != -1) goto LAB_00612c30;
          QDir::QDir((QDir *)local_68.data,(QString *)&local_d8);
          cVar3 = QDir::rename((QString *)local_68.data,(QString *)&local_b8);
          QDir::~QDir((QDir *)local_68.data);
          if (cVar3 == '\0') goto LAB_00612c30;
          pQVar10 = &this_01->root;
          if ((idx->m).ptr != (QAbstractItemModel *)0x0) {
            pQVar10 = (QFileSystemNode *)idx->i;
          }
          pQVar8 = &this_01->root;
          if (-1 < (idx->c | idx->r)) {
            pQVar8 = pQVar10;
          }
          pQVar10 = pQVar8->parent;
          pNVar7 = QHashPrivate::
                   Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::
                   findNode<QString>((pQVar10->children).d,&pQVar8->fileName);
          this_00 = &pQVar10->visibleChildren;
          QVar14.m_data = (pNVar7->value->fileName).d.ptr;
          QVar14.m_size = (pNVar7->value->fileName).d.size;
          iVar4 = QtPrivate::QStringList_indexOf((QList_conflict *)this_00,QVar14,0,CaseSensitive);
          QList<QString>::removeAt(this_00,(long)iVar4);
          pQVar8 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::takeImpl<QString>
                             (&pQVar10->children,&local_b8);
          QString::operator=(&pQVar8->fileName,(QString *)&local_98);
          pQVar8->parent = pQVar10;
          this_02 = (this_01->fileInfoGatherer)._M_t.
                    super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                    .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl;
          QDir::QDir(local_e0,(QString *)&local_d8);
          QFileInfo::QFileInfo((QFileInfo *)&local_78,local_e0,(QString *)&local_98);
          QFileInfoGatherer::getInfo
                    ((QExtendedInformation *)&local_68,(QFileInfoGatherer *)this_02,
                     (QFileInfo *)&local_78);
          QFileSystemModelPrivate::QFileSystemNode::populate
                    (pQVar8,(QExtendedInformation *)&local_68);
          QExtendedInformation::~QExtendedInformation((QExtendedInformation *)&local_68);
          QFileInfo::~QFileInfo((QFileInfo *)&local_78);
          QDir::~QDir(local_e0);
          pQVar8->isVisible = true;
          local_78.m_size = 0;
          ppQVar9 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::operator[]
                              (&pQVar10->children,&local_98);
          *ppQVar9 = pQVar8;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)this_00,(long)iVar4,&local_98);
          QList<QString>::begin(this_00);
          QFileSystemModelPrivate::delayedSort(this_01);
          local_68.shared = (PrivateShared *)0x0;
          local_68._8_8_ = &local_d8;
          local_68._16_8_ = &local_b8;
          local_50 = &local_98;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_68.shared);
          std::
          unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
          ::~unique_ptr((unique_ptr<QFileSystemModelPrivate::QFileSystemNode,_std::default_delete<QFileSystemModelPrivate::QFileSystemNode>_>
                         *)&local_78);
          bVar11 = true;
        }
        piVar2 = (int *)CONCAT44(local_d8.d.d._4_4_,local_d8.d.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_d8.d.d._4_4_,local_d8.d.d._0_4_),2,0x10);
          }
        }
      }
      piVar2 = (int *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_006128b9;
    }
  }
  bVar11 = false;
LAB_006128b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::setData(const QModelIndex &idx, const QVariant &value, int role)
{
    Q_D(QFileSystemModel);
    if (!idx.isValid()
        || idx.column() != 0
        || role != Qt::EditRole
        || (flags(idx) & Qt::ItemIsEditable) == 0) {
        return false;
    }

    QString newName = value.toString();
#ifdef Q_OS_WIN
    chopSpaceAndDot(newName);
    if (newName.isEmpty())
        return false;
#endif

    QString oldName = idx.data().toString();
    if (newName == oldName)
        return true;

    const QString parentPath = filePath(parent(idx));

    if (newName.isEmpty() || QDir::toNativeSeparators(newName).contains(QDir::separator()))
        return false;

#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to renaming to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(idx);
#endif // filesystemwatcher && Q_OS_WIN
    if (!QDir(parentPath).rename(oldName, newName)) {
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
        d->watchPaths(watchedPaths);
#endif
        return false;
    } else {
        /*
            *After re-naming something we don't want the selection to change*
            - can't remove rows and later insert
            - can't quickly remove and insert
            - index pointer can't change because treeview doesn't use persistent index's

            - if this get any more complicated think of changing it to just
              use layoutChanged
         */

        QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(idx);
        QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
        int visibleLocation = parentNode->visibleLocation(parentNode->children.value(indexNode->fileName)->fileName);

        parentNode->visibleChildren.removeAt(visibleLocation);
        std::unique_ptr<QFileSystemModelPrivate::QFileSystemNode> nodeToRename(parentNode->children.take(oldName));
        nodeToRename->fileName = newName;
        nodeToRename->parent = parentNode;
#if QT_CONFIG(filesystemwatcher)
        nodeToRename->populate(d->fileInfoGatherer->getInfo(QFileInfo(parentPath, newName)));
#endif
        nodeToRename->isVisible = true;
        parentNode->children[newName] = nodeToRename.release();
        parentNode->visibleChildren.insert(visibleLocation, newName);

        d->delayedSort();
        emit fileRenamed(parentPath, oldName, newName);
    }
    return true;
}